

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_keeper.h
# Opt level: O0

void __thiscall
mp::
ConstraintKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::LinearFunctionalConstraint>
::WriteCon2JSON(ConstraintKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::LinearFunctionalConstraint>
                *this,MemoryWriter *wrt,int i_con,Container *cnt)

{
  int iVar1;
  basic_string_view<char,_std::char_traits<char>_> *this_00;
  Container *in_RCX;
  BasicMemoryWriter<char,_std::allocator<char>_> *in_RSI;
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> jw;
  char **in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee4;
  char *in_stack_fffffffffffffee8;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffef0;
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> *in_stack_ffffffffffffff18;
  string_view in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff48;
  int iVar2;
  JSONW *in_stack_ffffffffffffff50;
  BasicConstraintKeeper *in_stack_ffffffffffffff90;
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> local_30;
  Container *local_20;
  
  local_20 = in_RCX;
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::MiniJSONWriter
            (&local_30,in_RSI);
  BasicConstraintKeeper::GetShortTypeName(in_stack_ffffffffffffff90);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::operator[]
            (in_stack_ffffffffffffff18,in_stack_ffffffffffffff20);
  MiniJSONWriter<fmt::BasicMemoryWriter<char,std::allocator<char>>>::operator=
            ((MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> *)
             CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),in_stack_fffffffffffffed8
            );
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::~MiniJSONWriter
            ((MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> *)0x483ca5);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::operator[]
            (in_stack_ffffffffffffff18,in_stack_ffffffffffffff20);
  MiniJSONWriter<fmt::BasicMemoryWriter<char,std::allocator<char>>>::operator=
            ((MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> *)
             CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
             (int *)in_stack_fffffffffffffed8);
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::~MiniJSONWriter
            ((MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> *)0x483d04);
  Container::GetCon((Container *)0x483d11);
  this_00 = (basic_string_view<char,_std::char_traits<char>_> *)
            BasicConstraint::name((BasicConstraint *)0x483d19);
  if ((char)this_00->_M_len != '\0') {
    Container::GetCon((Container *)0x483d3b);
    in_stack_fffffffffffffee8 = BasicConstraint::name((BasicConstraint *)0x483d43);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (this_00,in_stack_fffffffffffffee8);
    MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::operator[]
              (in_stack_ffffffffffffff18,in_stack_ffffffffffffff20);
    MiniJSONWriter<fmt::BasicMemoryWriter<char,std::allocator<char>>>::operator=
              ((MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> *)
               CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
               in_stack_fffffffffffffed8);
    MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::~MiniJSONWriter
              ((MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> *)0x483db0);
  }
  iVar1 = Container::GetDepth(local_20);
  iVar2 = iVar1;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (this_00,in_stack_fffffffffffffee8);
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::operator[]
            (in_stack_ffffffffffffff18,in_stack_ffffffffffffff20);
  MiniJSONWriter<fmt::BasicMemoryWriter<char,std::allocator<char>>>::operator=
            ((MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> *)
             CONCAT44(iVar1,in_stack_fffffffffffffee0),(int *)in_stack_fffffffffffffed8);
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::~MiniJSONWriter
            ((MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> *)0x483ea5);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (this_00,in_stack_fffffffffffffee8);
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::operator[]
            (in_stack_ffffffffffffff18,in_stack_ffffffffffffff20);
  Container::GetCon((Container *)0x483ee1);
  WriteJSON(in_stack_ffffffffffffff50,
            (LinearFunctionalConstraint *)CONCAT44(iVar2,in_stack_ffffffffffffff48));
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::~MiniJSONWriter
            ((MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> *)0x483efa);
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::~MiniJSONWriter
            ((MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> *)0x483f07);
  return;
}

Assistant:

void WriteCon2JSON(
      fmt::MemoryWriter& wrt, int i_con, const Container& cnt) {
    MiniJSONWriter jw(wrt);
    jw["CON_TYPE"] = GetShortTypeName();
    jw["index"] = i_con;
    if (*cnt.GetCon().name())
      jw["name"] = cnt.GetCon().name();
    jw["depth"] = cnt.GetDepth();
    WriteJSON(jw["data"], cnt.GetCon());
  }